

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *extension;
  int local_18;
  int index2_local;
  int index1_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._4_4_ = index2;
  local_18 = index1;
  index2_local = number;
  _index1_local = this;
  local_28 = FindOrNull(this,number);
  local_61 = 0;
  if (local_28 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x38b);
    local_61 = 1;
    pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: extension != nullptr: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(local_75,pLVar2);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  local_b1 = 0;
  if ((local_28->is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x38c);
    local_b1 = 1;
    pLVar2 = LogMessage::operator<<(&local_b0,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_b2,pLVar2);
  }
  if ((local_b1 & 1) != 0) {
    LogMessage::~LogMessage(&local_b0);
  }
  CVar1 = anon_unknown_22::cpp_type(local_28->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
    RepeatedField<int>::SwapElements
              ((local_28->field_0).repeated_int32_t_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::SwapElements
              ((local_28->field_0).repeated_int64_t_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::SwapElements
              ((local_28->field_0).repeated_uint32_t_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::SwapElements
              ((local_28->field_0).repeated_uint64_t_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::SwapElements
              ((local_28->field_0).repeated_double_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::SwapElements
              ((local_28->field_0).repeated_float_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::SwapElements
              ((local_28->field_0).repeated_bool_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_ENUM:
    RepeatedField<int>::SwapElements
              ((local_28->field_0).repeated_int32_t_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::SwapElements((local_28->field_0).repeated_string_value,local_18,extension._4_4_);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrField<google::protobuf::MessageLite>::SwapElements
              ((local_28->field_0).repeated_message_value,local_18,extension._4_4_);
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}